

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QCache<QString,_QConfFile>::Node>::findBucketWithHash<QString>
          (Data<QCache<QString,_QConfFile>::Node> *this,QString *key,size_t hash)

{
  ulong uVar1;
  Span *pSVar2;
  char16_t *pcVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  Span *pSVar8;
  Span *pSVar9;
  ulong uVar10;
  QStringView rhs;
  QStringView lhs;
  Bucket BVar11;
  
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  uVar10 = uVar1 - 1 & hash;
  pSVar8 = pSVar2 + (uVar10 >> 7);
  uVar10 = (ulong)((uint)uVar10 & 0x7f);
  pcVar3 = (key->d).ptr;
  lVar4 = (key->d).size;
  do {
    uVar7 = (ulong)pSVar8->offsets[uVar10];
    if (uVar7 == 0xff) {
LAB_00442937:
      bVar6 = false;
    }
    else {
      lVar5 = *(long *)(pSVar8->entries[uVar7].storage.data + 0x20);
      if (lVar5 == lVar4) {
        rhs.m_data = pcVar3;
        rhs.m_size = lVar4;
        lhs.m_data = *(storage_type_conflict **)(pSVar8->entries[uVar7].storage.data + 0x18);
        lhs.m_size = lVar5;
        bVar6 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar6) goto LAB_00442937;
      }
      uVar10 = uVar10 + 1;
      bVar6 = true;
      if (uVar10 == 0x80) {
        pSVar9 = pSVar8 + 1;
        pSVar8 = pSVar2;
        if (((long)pSVar9 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (uVar1 >> 7) != 0) {
          pSVar8 = pSVar9;
        }
        uVar10 = 0;
      }
    }
    if (!bVar6) {
      BVar11.index = uVar10;
      BVar11.span = pSVar8;
      return BVar11;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }